

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cc
# Opt level: O2

Instr * __thiscall
flow::IRBuilder::createStore(IRBuilder *this,Value *lhs,ConstantInt *index,Value *rhs,string *name)

{
  long lVar1;
  Instr *pIVar2;
  Value *rhs_local;
  ConstantInt *index_local;
  Value *lhs_local;
  string local_38;
  
  rhs_local = rhs;
  index_local = index;
  lhs_local = lhs;
  if (lhs != (Value *)0x0) {
    lVar1 = __dynamic_cast(lhs,&Value::typeinfo,&AllocaInstr::typeinfo,0);
    if (lVar1 != 0) {
      makeName(&local_38,this,name);
      pIVar2 = &insert<flow::StoreInstr,flow::Value*&,flow::ConstantValue<long,(flow::LiteralType)2>*&,flow::Value*&,std::__cxx11::string>
                          (this,&lhs_local,&index_local,&rhs_local,&local_38)->super_Instr;
      std::__cxx11::string::~string((string *)&local_38);
      return pIVar2;
    }
  }
  __assert_fail("dynamic_cast<AllocaInstr*>(lhs) && \"lhs must be of type AllocaInstr in order to STORE to.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianparpart[P]flow/src/flow/ir/IRBuilder.cc"
                ,0x7d,
                "Instr *flow::IRBuilder::createStore(Value *, ConstantInt *, Value *, const std::string &)"
               );
}

Assistant:

Instr* IRBuilder::createStore(Value* lhs, ConstantInt* index, Value* rhs,
                              const std::string& name) {
  assert(dynamic_cast<AllocaInstr*>(lhs) &&
         "lhs must be of type AllocaInstr in order to STORE to.");
  // assert(lhs->type() == rhs->type() && "Type of lhs and rhs must be equal.");
  // assert(dynamic_cast<IRVariable*>(lhs) && "lhs must be of type Variable.");

  return insert<StoreInstr>(lhs, index, rhs, makeName(name));
}